

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::CreateDescriptorKeyRequest::CreateDescriptorKeyRequest
          (CreateDescriptorKeyRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::CreateDescriptorKeyRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateDescriptorKeyRequest_00a874b0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->key_,"");
  (this->parent_extkey_)._M_dataplus._M_p = (pointer)&(this->parent_extkey_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->parent_extkey_,"");
  (this->key_path_from_parent_)._M_dataplus._M_p = (pointer)&(this->key_path_from_parent_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->key_path_from_parent_,"");
  CollectFieldName();
  return;
}

Assistant:

CreateDescriptorKeyRequest() {
    CollectFieldName();
  }